

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

void __thiscall
cmSourceFileLocation::cmSourceFileLocation(cmSourceFileLocation *this,cmMakefile *mf,string *name)

{
  string *in_relative;
  bool bVar1;
  string sStack_48;
  
  this->Makefile = mf;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  in_relative = &this->Directory;
  (this->Name).field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::FileIsFullPath((name->_M_dataplus)._M_p);
  this->AmbiguousDirectory = !bVar1;
  this->AmbiguousExtension = true;
  cmsys::SystemTools::GetFilenamePath(&sStack_48,name);
  std::__cxx11::string::operator=((string *)in_relative,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  bVar1 = cmsys::SystemTools::FileIsFullPath((in_relative->_M_dataplus)._M_p);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&sStack_48,in_relative);
    std::__cxx11::string::operator=((string *)in_relative,(string *)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  cmsys::SystemTools::GetFilenameName(&sStack_48,name);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  UpdateExtension(this,name);
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation(cmMakefile const* mf,
                                           const std::string& name)
  : Makefile(mf)
{
  this->AmbiguousDirectory = !cmSystemTools::FileIsFullPath(name.c_str());
  this->AmbiguousExtension = true;
  this->Directory = cmSystemTools::GetFilenamePath(name);
  if (cmSystemTools::FileIsFullPath(this->Directory.c_str())) {
    this->Directory = cmSystemTools::CollapseFullPath(this->Directory);
  }
  this->Name = cmSystemTools::GetFilenameName(name);
  this->UpdateExtension(name);
}